

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

uint ecc_edwards_eq(EdwardsPoint *P,EdwardsPoint *Q)

{
  EdwardsCurve *pEVar1;
  uint uVar2;
  uint uVar3;
  
  pEVar1 = P->ec;
  if (Q->ec == pEVar1) {
    uVar2 = projective_eq(pEVar1->mc,P->X,P->Z,Q->X,Q->Z);
    uVar3 = projective_eq(pEVar1->mc,P->Y,P->Z,Q->Y,Q->Z);
    return uVar3 & uVar2;
  }
  __assert_fail("Q->ec == ec",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x483,"unsigned int ecc_edwards_eq(EdwardsPoint *, EdwardsPoint *)");
}

Assistant:

unsigned ecc_edwards_eq(EdwardsPoint *P, EdwardsPoint *Q)
{
    EdwardsCurve *ec = P->ec;
    assert(Q->ec == ec);

    return (projective_eq(ec->mc, P->X, P->Z, Q->X, Q->Z) &
            projective_eq(ec->mc, P->Y, P->Z, Q->Y, Q->Z));
}